

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeSetNumCols(Vdbe *p,int nResColumn)

{
  ushort uVar1;
  sqlite3 *db;
  Mem *p_00;
  
  db = p->db;
  uVar1 = p->nResAlloc;
  if (uVar1 != 0) {
    releaseMemArray(p->aColName,(uint)uVar1 + (uint)uVar1 * 4);
    sqlite3DbFree(db,p->aColName);
  }
  p->nResAlloc = (u16)nResColumn;
  p->nResColumn = (u16)nResColumn;
  p_00 = (Mem *)sqlite3DbMallocRawNN(db,(long)(nResColumn * 5) * 0x38);
  p->aColName = p_00;
  if (p_00 != (Mem *)0x0) {
    initMemArray(p_00,nResColumn * 5,db,1);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetNumCols(Vdbe *p, int nResColumn){
  int n;
  sqlite3 *db = p->db;

  if( p->nResAlloc ){
    releaseMemArray(p->aColName, p->nResAlloc*COLNAME_N);
    sqlite3DbFree(db, p->aColName);
  }
  n = nResColumn*COLNAME_N;
  p->nResColumn = p->nResAlloc = (u16)nResColumn;
  p->aColName = (Mem*)sqlite3DbMallocRawNN(db, sizeof(Mem)*n );
  if( p->aColName==0 ) return;
  initMemArray(p->aColName, n, db, MEM_Null);
}